

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiffdec.c
# Opt level: O1

int ReadTIFF(uint8_t *data,size_t data_size,WebPPicture *pic,int keep_alpha,Metadata *metadata)

{
  byte bVar1;
  long lVar2;
  bool bVar3;
  ushort uVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  uint8_t *rgba;
  uint uVar8;
  undefined4 uVar9;
  char *__format;
  uint8_t *puVar10;
  long lVar11;
  uint64_t stride;
  uint32_t image_height;
  uint16_t samples_per_px;
  uint32_t image_width;
  uint16_t extra_samples;
  uint32_t tile_height;
  uint32_t tile_width;
  Metadata *local_70;
  WebPPicture *local_68;
  uint local_5c;
  uint16_t *extra_samples_ptr;
  toff_t exif_ifd_offset;
  MyData my_data;
  
  my_data.pos = 0;
  samples_per_px = 0;
  extra_samples = 0;
  extra_samples_ptr = (uint16_t *)0x0;
  if (pic == (WebPPicture *)0x0) {
    return 0;
  }
  if (data == (uint8_t *)0x0) {
    return 0;
  }
  if (data_size - 0x80000000 < 0xffffffff80000001) {
    return 0;
  }
  my_data.data = data;
  my_data.size = data_size;
  lVar7 = TIFFClientOpen("Memory","r",&my_data,MyRead,MyRead,MySeek,MyClose,MySize,MyMapFile,
                         MyUnmapFile);
  if (lVar7 == 0) {
    ReadTIFF_cold_8();
    return 0;
  }
  uVar4 = TIFFNumberOfDirectories(lVar7);
  if (1 < uVar4) {
    ReadTIFF_cold_1();
  }
  iVar6 = 0;
  iVar5 = TIFFGetFieldDefaulted(lVar7,0x115,&samples_per_px);
  if (iVar5 == 0) {
    ReadTIFF_cold_7();
  }
  else {
    iVar6 = 0;
    if (0xfffd < (ushort)(samples_per_px - 5)) {
      iVar6 = 0;
      iVar5 = TIFFGetField(lVar7,0x100,&image_width);
      if ((iVar5 == 0) || (iVar5 = TIFFGetField(lVar7,0x101,&image_height), iVar5 == 0)) {
        ReadTIFF_cold_6();
      }
      else {
        stride = (ulong)image_width * 4;
        iVar6 = ImgIoUtilCheckSizeArgumentsOverflow(stride,(ulong)image_height);
        if (iVar6 == 0) {
          __format = "Error! TIFF image dimension (%d x %d) is too large.\n";
          tile_height = image_height;
          tile_width = image_width;
        }
        else {
          iVar6 = TIFFGetField(lVar7,0x142,&tile_width);
          if (((iVar6 == 0) || (iVar6 = TIFFGetField(lVar7,0x143,&tile_height), iVar6 == 0)) ||
             ((((ulong)tile_width < 0x21 || (tile_width >> 1 <= image_width)) &&
              ((((ulong)tile_height < 0x21 || (tile_height >> 1 <= image_height)) &&
               (iVar6 = ImgIoUtilCheckSizeArgumentsOverflow
                                  ((ulong)tile_width << 2,(ulong)tile_height), iVar6 == 0)))))) {
            if (3 < samples_per_px) {
              iVar6 = 0;
              iVar5 = TIFFGetField(lVar7,0x152,&extra_samples,&extra_samples_ptr);
              if (iVar5 == 0) {
                ReadTIFF_cold_5();
                goto LAB_0010a2ae;
              }
            }
            if (-1 < (long)(image_height * stride)) {
              rgba = (uint8_t *)_TIFFmalloc();
              if (rgba == (uint8_t *)0x0) {
                ReadTIFF_cold_2();
                iVar6 = 0;
              }
              else {
                iVar6 = TIFFReadRGBAImageOriented(lVar7,image_width,image_height,rgba,1);
                if (iVar6 == 0) {
                  iVar6 = 0;
                }
                else {
                  pic->width = image_width;
                  pic->height = image_height;
                  if (((extra_samples_ptr != (uint16_t *)0x0 && extra_samples == 1) &&
                      (*extra_samples_ptr == 1)) && (image_height != 0)) {
                    uVar8 = 0;
                    puVar10 = rgba;
                    do {
                      if (0 < (int)image_width) {
                        lVar11 = 0;
                        do {
                          bVar1 = puVar10[lVar11 * 4 + 3];
                          if (bVar1 != 0xff) {
                            if (bVar1 == 0) {
                              (puVar10 + lVar11 * 4 + 1)[0] = '\0';
                              (puVar10 + lVar11 * 4 + 1)[1] = '\0';
                              puVar10[lVar11 * 4] = '\0';
                            }
                            else {
                              iVar6 = (int)(0xff000000 / (ulong)bVar1);
                              puVar10[lVar11 * 4] =
                                   (uint8_t)((uint)puVar10[lVar11 * 4] * iVar6 + 0x800000 >> 0x18);
                              puVar10[lVar11 * 4 + 1] =
                                   (uint8_t)((uint)puVar10[lVar11 * 4 + 1] * iVar6 + 0x800000 >>
                                            0x18);
                              puVar10[lVar11 * 4 + 2] =
                                   (uint8_t)((uint)puVar10[lVar11 * 4 + 2] * iVar6 + 0x800000 >>
                                            0x18);
                            }
                          }
                          lVar11 = lVar11 + 1;
                        } while (image_width != (uint32_t)lVar11);
                      }
                      puVar10 = puVar10 + stride;
                      uVar8 = uVar8 + 1;
                    } while (uVar8 < image_height);
                  }
                  if (keep_alpha == 0) {
                    iVar6 = WebPPictureImportRGBX(pic,rgba,(int)stride);
                  }
                  else {
                    iVar6 = WebPPictureImportRGBA(pic,rgba,(int)stride);
                  }
                }
                _TIFFfree(rgba);
              }
              if ((metadata == (Metadata *)0x0) || (iVar6 == 0)) goto LAB_0010a2ae;
              uVar9 = 0x8773;
              lVar11 = 0;
              local_70 = metadata;
              local_68 = pic;
              do {
                lVar2 = *(long *)((long)&kTIFFMetadataMap[0].storage_offset + lVar11);
                iVar6 = TIFFGetField(lVar7,uVar9,&local_5c,&exif_ifd_offset);
                if ((iVar6 != 0) &&
                   (iVar6 = MetadataCopy((char *)exif_ifd_offset,(ulong)local_5c,
                                         (MetadataPayload *)((long)&(local_70->exif).bytes + lVar2))
                   , iVar6 == 0)) {
                  iVar6 = 0;
                  bVar3 = true;
                  goto LAB_0010a244;
                }
                uVar9 = *(undefined4 *)((long)&kTIFFMetadataMap[1].tag + lVar11);
                lVar11 = lVar11 + 0x10;
              } while (lVar11 != 0x20);
              bVar3 = false;
              iVar5 = TIFFGetField(lVar7,0x8769,&exif_ifd_offset);
              iVar6 = 1;
              if (iVar5 != 0) {
                ReadTIFF_cold_3();
                bVar3 = false;
              }
LAB_0010a244:
              if (!bVar3) goto LAB_0010a2ae;
              ReadTIFF_cold_4();
            }
            iVar6 = 0;
            goto LAB_0010a2ae;
          }
          __format = "Error! TIFF tile dimension (%d x %d) is too large.\n";
        }
        iVar6 = 0;
        fprintf(_stderr,__format,(ulong)tile_width,(ulong)tile_height);
      }
    }
  }
LAB_0010a2ae:
  TIFFClose(lVar7);
  return iVar6;
}

Assistant:

int ReadTIFF(const uint8_t* const data, size_t data_size,
             WebPPicture* const pic, int keep_alpha,
             Metadata* const metadata) {
  MyData my_data = { data, (toff_t)data_size, 0 };
  TIFF* tif;
  uint32_t image_width, image_height, tile_width, tile_height;
  uint64_t stride;
  uint16_t samples_per_px = 0;
  uint16_t extra_samples = 0;
  uint16_t* extra_samples_ptr = NULL;
  uint32_t* raster;
  int64_t alloc_size;
  int ok = 0;
  tdir_t dircount;

  if (data == NULL || data_size == 0 || data_size > INT_MAX || pic == NULL) {
    return 0;
  }

  tif = TIFFClientOpen("Memory", "r", &my_data,
                       MyRead, MyRead, MySeek, MyClose,
                       MySize, MyMapFile, MyUnmapFile);
  if (tif == NULL) {
    fprintf(stderr, "Error! Cannot parse TIFF file\n");
    return 0;
  }

  dircount = TIFFNumberOfDirectories(tif);
  if (dircount > 1) {
    fprintf(stderr, "Warning: multi-directory TIFF files are not supported.\n"
                    "Only the first will be used, %d will be ignored.\n",
                    dircount - 1);
  }
  if (!TIFFGetFieldDefaulted(tif, TIFFTAG_SAMPLESPERPIXEL, &samples_per_px)) {
    fprintf(stderr, "Error! Cannot retrieve TIFF samples-per-pixel info.\n");
    goto End;
  }
  if (samples_per_px < 3 || samples_per_px > 4) goto End;  // not supported

  if (!(TIFFGetField(tif, TIFFTAG_IMAGEWIDTH, &image_width) &&
        TIFFGetField(tif, TIFFTAG_IMAGELENGTH, &image_height))) {
    fprintf(stderr, "Error! Cannot retrieve TIFF image dimensions.\n");
    goto End;
  }
  stride = (uint64_t)image_width * sizeof(*raster);
  if (!ImgIoUtilCheckSizeArgumentsOverflow(stride, image_height)) {
    fprintf(stderr, "Error! TIFF image dimension (%d x %d) is too large.\n",
            image_width, image_height);
    goto End;
  }

  // According to spec, a tile can be bigger than the image. However it should
  // be a multiple of 16 and not way too large, so check that it's not more
  // than twice the image size, for dimensions above some arbitrary minimum
  // 32. We also check that they respect WebP's dimension and memory limit.
  // Note that a tile can be 6byte/px in some cases. Here we assume
  // 4byte/px with sizeof(*raster), to be conservative.
  if (TIFFGetField(tif, TIFFTAG_TILEWIDTH, &tile_width) &&
      TIFFGetField(tif, TIFFTAG_TILELENGTH, &tile_height)) {
    if ((tile_width > 32 && tile_width / 2 > image_width) ||
        (tile_height > 32 && tile_height / 2 > image_height) ||
        ImgIoUtilCheckSizeArgumentsOverflow(
            (uint64_t)tile_width * sizeof(*raster), tile_height)) {
      fprintf(stderr, "Error! TIFF tile dimension (%d x %d) is too large.\n",
              tile_width, tile_height);
      goto End;
    }
  }

  if (samples_per_px > 3 && !TIFFGetField(tif, TIFFTAG_EXTRASAMPLES,
                                          &extra_samples, &extra_samples_ptr)) {
    fprintf(stderr, "Error! Cannot retrieve TIFF ExtraSamples info.\n");
    goto End;
  }

  // _Tiffmalloc uses a signed type for size.
  alloc_size = (int64_t)(stride * image_height);
  if (alloc_size < 0 || alloc_size != (tsize_t)alloc_size) goto End;

  raster = (uint32_t*)_TIFFmalloc((tsize_t)alloc_size);
  if (raster != NULL) {
    if (TIFFReadRGBAImageOriented(tif, image_width, image_height, raster,
                                  ORIENTATION_TOPLEFT, 1)) {
      pic->width = image_width;
      pic->height = image_height;
      // TIFF data is ABGR
#ifdef WORDS_BIGENDIAN
      TIFFSwabArrayOfLong(raster, image_width * image_height);
#endif
      // if we have an alpha channel, we must un-multiply from rgbA to RGBA
      if (extra_samples == 1 && extra_samples_ptr != NULL &&
          extra_samples_ptr[0] == EXTRASAMPLE_ASSOCALPHA) {
        uint32_t y;
        uint8_t* tmp = (uint8_t*)raster;
        for (y = 0; y < image_height; ++y) {
          MultARGBRow(tmp, image_width);
          tmp += stride;
        }
      }
      ok = keep_alpha
         ? WebPPictureImportRGBA(pic, (const uint8_t*)raster, (int)stride)
         : WebPPictureImportRGBX(pic, (const uint8_t*)raster, (int)stride);
    }
    _TIFFfree(raster);
  } else {
    fprintf(stderr, "Error allocating TIFF RGBA memory!\n");
  }

  if (ok) {
    if (metadata != NULL) {
      ok = ExtractMetadataFromTIFF(tif, metadata);
      if (!ok) {
        fprintf(stderr, "Error extracting TIFF metadata!\n");
        MetadataFree(metadata);
        WebPPictureFree(pic);
      }
    }
  }
 End:
  TIFFClose(tif);
  return ok;
}